

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

void * __thiscall
btHashedOverlappingPairCache::removeOverlappingPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          btDispatcher *dispatcher)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  btOverlappingPairCallback *pbVar4;
  btBroadphaseProxy *pbVar5;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 aVar6;
  uint uVar7;
  btBroadphasePair *pbVar8;
  int *piVar9;
  void *pvVar10;
  int iVar11;
  btBroadphaseProxy *pbVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  long lVar16;
  
  gRemovePairs = gRemovePairs + 1;
  pbVar12 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pbVar12 = proxy0;
    proxy0 = proxy1;
  }
  uVar7 = getHash(this,proxy0->m_uniqueId,pbVar12->m_uniqueId);
  uVar14 = (long)(int)uVar7 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
  pbVar8 = internalFindPair(this,proxy0,pbVar12,(int)uVar14);
  if (pbVar8 == (btBroadphasePair *)0x0) {
    pvVar10 = (void *)0x0;
  }
  else {
    (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
      _vptr_btOverlappingPairCallback[8])(this,pbVar8,dispatcher);
    pvVar10 = (pbVar8->field_3).m_internalInfo1;
    piVar15 = (this->m_hashTable).m_data + uVar14;
    piVar3 = (this->m_next).m_data;
    piVar9 = piVar15;
    iVar11 = -1;
    while( true ) {
      iVar2 = *piVar9;
      iVar13 = (int)((ulong)((long)pbVar8 - (long)(this->m_overlappingPairArray).m_data) >> 5);
      if (iVar2 == iVar13) break;
      piVar9 = piVar3 + iVar2;
      iVar11 = iVar2;
    }
    piVar9 = piVar3 + iVar11;
    if (iVar11 == -1) {
      piVar9 = piVar15;
    }
    *piVar9 = piVar3[iVar13];
    lVar16 = (long)(this->m_overlappingPairArray).m_size;
    lVar1 = lVar16 + -1;
    pbVar4 = this->m_ghostPairCallback;
    if (pbVar4 != (btOverlappingPairCallback *)0x0) {
      (*pbVar4->_vptr_btOverlappingPairCallback[3])(pbVar4,proxy0,pbVar12,dispatcher);
    }
    if ((int)lVar1 != iVar13) {
      pbVar8 = (this->m_overlappingPairArray).m_data;
      uVar7 = getHash(this,(pbVar8[lVar1].m_pProxy0)->m_uniqueId,
                      (pbVar8[lVar1].m_pProxy1)->m_uniqueId);
      uVar14 = (long)(int)uVar7 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
      piVar3 = (this->m_next).m_data;
      piVar15 = (this->m_hashTable).m_data + uVar14;
      piVar9 = piVar15;
      iVar11 = -1;
      while (iVar2 = *piVar9, iVar2 != (int)lVar1) {
        iVar11 = iVar2;
        piVar9 = piVar3 + iVar2;
      }
      piVar9 = piVar3 + iVar11;
      if (iVar11 == -1) {
        piVar9 = piVar15;
      }
      *piVar9 = piVar3[lVar16 + -1];
      pbVar8 = (this->m_overlappingPairArray).m_data;
      pbVar12 = pbVar8[lVar1].m_pProxy0;
      pbVar5 = pbVar8[lVar1].m_pProxy1;
      aVar6 = *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(&pbVar8[lVar1].m_algorithm + 1);
      pbVar8[iVar13].m_algorithm = pbVar8[lVar1].m_algorithm;
      *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(&pbVar8[iVar13].m_algorithm + 1) = aVar6;
      pbVar8[iVar13].m_pProxy0 = pbVar12;
      pbVar8[iVar13].m_pProxy1 = pbVar5;
      piVar9 = (this->m_hashTable).m_data;
      (this->m_next).m_data[iVar13] = piVar9[uVar14];
      piVar9[uVar14] = iVar13;
    }
    piVar9 = &(this->m_overlappingPairArray).m_size;
    *piVar9 = *piVar9 + -1;
  }
  return pvVar10;
}

Assistant:

void* btHashedOverlappingPairCache::removeOverlappingPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1,btDispatcher* dispatcher)
{
	gRemovePairs++;
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));

	btBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair == NULL)
	{
		return 0;
	}

	cleanOverlappingPair(*pair,dispatcher);

	void* userData = pair->m_internalInfo1;

	btAssert(pair->m_pProxy0->getUid() == proxyId1);
	btAssert(pair->m_pProxy1->getUid() == proxyId2);

	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	btAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	btAssert(index != BT_NULL_PAIR);

	int previous = BT_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		btAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	if (m_ghostPairCallback)
		m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1,dispatcher);

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const btBroadphasePair* last = &m_overlappingPairArray[lastPairIndex];
		/* missing swap here too, Nat. */ 
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_pProxy0->getUid()), static_cast<unsigned int>(last->m_pProxy1->getUid())) & (m_overlappingPairArray.capacity()-1));

	index = m_hashTable[lastHash];
	btAssert(index != BT_NULL_PAIR);

	previous = BT_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		btAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}